

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O2

void clearkeys(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  Node *pNVar2;
  int iVar3;
  Table *h;
  TValue *o;
  
  for (; l != (GCObject *)0x0; l = (l->h).gclist) {
    pNVar2 = (l->h).node;
    bVar1 = (l->h).lsizenode;
    for (o = (TValue *)&pNVar2->i_key; (Node *)(o + -1) < pNVar2 + (1 << (bVar1 & 0x1f));
        o = (TValue *)&o[2].tt_) {
      if (o[-1].tt_ != 0) {
        iVar3 = iscleared(g,o);
        if (iVar3 != 0) {
          o[-1].tt_ = 0;
          removeentry((Node *)(o + -1));
        }
      }
    }
  }
  return;
}

Assistant:

static void clearkeys (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && (iscleared(g, gkey(n)))) {
        setnilvalue(gval(n));  /* remove value ... */
        removeentry(n);  /* and remove entry from table */
      }
    }
  }
}